

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_1::BuiltinGlFrontFacingCase::initPrograms
          (BuiltinGlFrontFacingCase *this,SourceCollections *programCollection)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  string local_3f8;
  ShaderSource local_3d8;
  allocator<char> local_3a9;
  string local_3a8;
  ostringstream local_388 [8];
  ostringstream fragmentSource;
  string local_210;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream vertexSource;
  SourceCollections *programCollection_local;
  BuiltinGlFrontFacingCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar2 = std::operator<<((ostream *)local_190,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in highp vec4 position;\n");
  poVar2 = std::operator<<(poVar2,"void main()\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"gl_Position = position;\n");
  poVar2 = std::operator<<(poVar2,"gl_PointSize = 1.0;\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"vert",&local_1c1);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1f0,&local_210);
  glu::ProgramSources::operator<<(pPVar3,&local_1f0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_388);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar2 = std::operator<<((ostream *)local_388,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out mediump vec4 color;\n");
  poVar2 = std::operator<<(poVar2,"void main()\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"if (gl_FrontFacing)\n");
  poVar2 = std::operator<<(poVar2,"\tcolor = vec4(1.0, 0.0, 0.0, 1.0);\n");
  poVar2 = std::operator<<(poVar2,"else\n");
  poVar2 = std::operator<<(poVar2,"\tcolor = vec4(0.0, 1.0, 0.0, 1.0);\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"frag",&local_3a9);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_3a8);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_3d8,&local_3f8);
  glu::ProgramSources::operator<<(pPVar3,&local_3d8);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::ostringstream::~ostringstream(local_388);
  return;
}

Assistant:

void BuiltinGlFrontFacingCase::initPrograms (SourceCollections& programCollection) const
{
	{
		std::ostringstream vertexSource;
		vertexSource << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) in highp vec4 position;\n"
			<< "void main()\n"
			<< "{\n"
			<< "gl_Position = position;\n"
			<< "gl_PointSize = 1.0;\n"
			<< "}\n";
		programCollection.glslSources.add("vert") << glu::VertexSource(vertexSource.str());
	}

	{
		std::ostringstream fragmentSource;
		fragmentSource << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "layout(location = 0) out mediump vec4 color;\n"
			<< "void main()\n"
			<< "{\n"
			<< "if (gl_FrontFacing)\n"
			<< "	color = vec4(1.0, 0.0, 0.0, 1.0);\n"
			<< "else\n"
			<< "	color = vec4(0.0, 1.0, 0.0, 1.0);\n"
			<< "}\n";
		programCollection.glslSources.add("frag") << glu::FragmentSource(fragmentSource.str());
	}
}